

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batcher.c
# Opt level: O3

size_t duckdb_je_batcher_pop_begin(tsdn_t *tsdn,batcher_t *batcher)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  
  sVar5 = 0xffffffffffffffff;
  if ((batcher->nelems).repr != 0) {
    __mutex = (pthread_mutex_t *)((long)&(batcher->mtx).field_0 + 0x48);
    iVar4 = pthread_mutex_trylock(__mutex);
    if (iVar4 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&batcher->mtx);
      (batcher->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(batcher->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((batcher->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (batcher->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(batcher->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    sVar3 = (batcher->nelems).repr;
    if (sVar3 == 0) {
      (batcher->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
    }
    else {
      (batcher->nelems).repr = 0;
      sVar5 = sVar3;
    }
  }
  return sVar5;
}

Assistant:

size_t
batcher_pop_begin(tsdn_t *tsdn, batcher_t *batcher) {
	size_t nelems_guess = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	assert(nelems_guess <= batcher->nelems_max);
	if (nelems_guess == 0) {
		return BATCHER_NO_IDX;
	}
	malloc_mutex_lock(tsdn, &batcher->mtx);
	size_t nelems = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	assert(nelems <= batcher->nelems_max);
	if (nelems == 0) {
		malloc_mutex_unlock(tsdn, &batcher->mtx);
		return BATCHER_NO_IDX;
	}
	atomic_store_zu(&batcher->nelems, 0, ATOMIC_RELAXED);
	return nelems;
}